

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void finishgencycle(lua_State *L,global_State *g)

{
  global_State *pgVar1;
  GCObject **ppGVar2;
  
  ppGVar2 = correctgraylist(&g->grayagain);
  *ppGVar2 = g->weak;
  g->weak = (GCObject *)0x0;
  ppGVar2 = correctgraylist(ppGVar2);
  *ppGVar2 = g->allweak;
  g->allweak = (GCObject *)0x0;
  ppGVar2 = correctgraylist(ppGVar2);
  *ppGVar2 = g->ephemeron;
  g->ephemeron = (GCObject *)0x0;
  correctgraylist(ppGVar2);
  checkSizes(L,g);
  g->gcstate = '\0';
  if (g->gcemergency == '\0') {
    pgVar1 = L->l_G;
    while (pgVar1->tobefnz != (GCObject *)0x0) {
      GCTM(L);
    }
  }
  return;
}

Assistant:

static void finishgencycle (lua_State *L, global_State *g) {
  correctgraylists(g);
  checkSizes(L, g);
  g->gcstate = GCSpropagate;  /* skip restart */
  if (!g->gcemergency)
    callallpendingfinalizers(L);
}